

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

Expression * __thiscall slang::ast::PortConnection::getExpression(PortConnection *this)

{
  PortSymbol *pPVar1;
  InstanceSymbolBase *inst;
  Compilation *this_00;
  bool bVar2;
  bool bVar3;
  ArgumentDirection direction;
  Expression *pEVar4;
  ulong uVar5;
  Type *pTVar6;
  Diagnostic *this_01;
  bitmask<slang::ast::AssignFlags> flags;
  Type *argType;
  ulong uVar7;
  LookupLocation LVar8;
  pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> pVar9;
  SourceRange sourceRange;
  SourceRange assignmentRange;
  SourceRange assignmentRange_00;
  Expression *e;
  ASTContext context;
  undefined1 in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff81;
  Type *local_78;
  Type *local_70;
  ASTContext local_68;
  
  if (this->expr != (Expression *)0x0) {
    return this->expr;
  }
  pPVar1 = (PortSymbol *)this->port;
  if ((pPVar1->super_Symbol).kind == InterfacePort) {
LAB_003f9621:
    pEVar4 = (Expression *)0x0;
  }
  else {
    if ((this->field_4).exprSyntax == (ExpressionSyntax *)0x0 &&
        this->connectedSymbol == (Symbol *)0x0) {
      if (this->useDefault != true) goto LAB_003f9621;
      pEVar4 = PortSymbol::getInitializer(pPVar1);
    }
    else {
      inst = (InstanceSymbolBase *)
             ((pPVar1->super_Symbol).parentScope)->thisSym[1].originatingSyntax;
      LVar8 = LookupLocation::after((Symbol *)inst);
      pPVar1 = (PortSymbol *)this->port;
      if ((pPVar1->super_Symbol).kind == Port) {
        bVar2 = PortSymbol::isNetPort(pPVar1);
        pVar9 = getDirAndType(this->port);
        argType = pVar9.second;
        direction = pVar9.first;
        uVar5 = (ulong)((uint)bVar2 << 0x1f) | 0x20;
      }
      else {
        pVar9 = getDirAndType((Symbol *)pPVar1);
        argType = pVar9.second;
        direction = pVar9.first;
        uVar5 = 0x20;
      }
      uVar7 = 0;
      if (direction - Out < 2) {
        uVar7 = (ulong)(direction == InOut) << 0x26 | 0x100000;
      }
      local_68.flags.m_bits =
           (ulong)(*(byte *)(*(long *)&inst[1].super_Symbol + 0x88) & 2) << 0x2b | uVar7 | uVar5;
      local_68.instanceOrProc = (Symbol *)0x0;
      local_68.firstTempVar = (TempVarSymbol *)0x0;
      local_68.randomizeDetails = (RandomizeDetails *)0x0;
      local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
      local_68.scope.ptr = LVar8.scope;
      local_68.lookupIndex = LVar8.index;
      ASTContext::setInstance(&local_68,inst);
      if (this->connectedSymbol != (Symbol *)0x0) {
        sourceRange.endLoc = (SourceLocation)0x0;
        sourceRange.startLoc = (this->field_4).implicitNameRange.endLoc;
        local_78 = (Type *)ValueExpressionBase::fromSymbol
                                     ((ValueExpressionBase *)&local_68,
                                      (ASTContext *)this->connectedSymbol,(Symbol *)0x0,
                                      (HierarchicalReference *)(this->field_4).exprSyntax,
                                      sourceRange,false,(bool)in_stack_ffffffffffffff80);
        flags.m_bits = (direction == Out) << 3;
        bVar2 = Type::isEquivalent((Type *)(local_78->super_Symbol).name._M_len,argType);
        if (!bVar2) {
          this_00 = (local_68.scope.ptr)->compilation;
          local_70 = (Type *)(local_78->super_Symbol).name._M_len;
          if (direction == Ref) {
            bVar2 = true;
          }
          else {
            if (direction == In) {
              assignmentRange.endLoc = (SourceLocation)0x0;
              assignmentRange.startLoc = (this->field_4).implicitNameRange.endLoc;
              local_78 = (Type *)Expression::convertAssignment
                                           ((Expression *)&local_68,(ASTContext *)argType,local_78,
                                            (Expression *)(this->field_4).exprSyntax,assignmentRange
                                            ,(Expression **)0x0,
                                            (bitmask<slang::ast::AssignFlags> *)
                                            CONCAT17(flags.m_bits,
                                                     CONCAT61(in_stack_ffffffffffffff81,
                                                              in_stack_ffffffffffffff80)));
            }
            else {
              pTVar6 = (Type *)BumpAllocator::
                               emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange_const&>
                                         (&this_00->super_BumpAllocator,argType,
                                          &(this->field_4).implicitNameRange);
              assignmentRange_00.endLoc = (SourceLocation)&local_78;
              assignmentRange_00.startLoc = (this->field_4).implicitNameRange.endLoc;
              Expression::convertAssignment
                        ((Expression *)&local_68,(ASTContext *)(local_78->super_Symbol).name._M_len,
                         pTVar6,(Expression *)(this->field_4).exprSyntax,assignmentRange_00,
                         (Expression **)&stack0xffffffffffffff87,
                         (bitmask<slang::ast::AssignFlags> *)
                         CONCAT17(flags.m_bits,
                                  CONCAT61(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80)));
            }
            if ((inst->arrayPath)._M_extent._M_extent_value != 0) goto LAB_003f988e;
            bVar2 = false;
          }
          bVar3 = Expression::bad((Expression *)local_78);
          if (!bVar3) {
            pTVar6 = argType->canonical;
            if (pTVar6 == (Type *)0x0) {
              Type::resolveCanonical(argType);
              pTVar6 = argType->canonical;
            }
            if ((pTVar6->super_Symbol).kind != ErrorType) {
              this_01 = ASTContext::addDiag(&local_68,(DiagCode)0xf00006,
                                            (this->field_4).implicitNameRange);
              Diagnostic::operator<<(this_01,this->port->name);
              ast::operator<<(this_01,argType);
              ast::operator<<(this_01,local_70);
              if (bVar2) {
                local_78 = (Type *)BumpAllocator::
                                   emplace<slang::ast::InvalidExpression,slang::ast::Expression*&,slang::ast::Type_const&>
                                             (&this_00->super_BumpAllocator,(Expression **)&local_78
                                              ,this_00->errorType);
              }
            }
          }
        }
LAB_003f988e:
        this->expr = (Expression *)local_78;
        bVar2 = Expression::bad((Expression *)local_78);
        if (!bVar2) {
          Expression::checkConnectionDirection
                    (this->expr,direction,&local_68,(this->expr->sourceRange).startLoc,flags);
        }
        return this->expr;
      }
      pEVar4 = Expression::bindArgument
                         (argType,direction,(bitmask<slang::ast::VariableFlags>)0x0,
                          (this->field_4).exprSyntax,&local_68);
    }
    this->expr = pEVar4;
  }
  return pEVar4;
}

Assistant:

const Expression* PortConnection::getExpression() const {
    if (expr || port.kind == SymbolKind::InterfacePort)
        return expr;

    if (connectedSymbol || exprSyntax) {
        auto& parentInstance = getParentInstance();
        auto ll = LookupLocation::after(parentInstance);
        auto scope = ll.getScope();
        SLANG_ASSERT(scope);

        const bool isNetPort = port.kind == SymbolKind::Port && port.as<PortSymbol>().isNetPort();
        auto [direction, type] = getDirAndType(port);

        bitmask<ASTFlags> flags = ASTFlags::NonProcedural;
        if (isNetPort)
            flags |= ASTFlags::AllowInterconnect;

        if (direction == ArgumentDirection::Out || direction == ArgumentDirection::InOut) {
            flags |= ASTFlags::LValue;
            if (direction == ArgumentDirection::InOut)
                flags |= ASTFlags::LAndRValue;
        }

        if (parentInstance.body.flags.has(InstanceFlags::FromBind))
            flags |= ASTFlags::BindInstantiation;

        ASTContext context(*scope, ll, flags);
        context.setInstance(parentInstance);

        if (connectedSymbol) {
            Expression* e = &ValueExpressionBase::fromSymbol(context, *connectedSymbol, nullptr,
                                                             implicitNameRange);

            bitmask<AssignFlags> assignFlags;
            if (direction == ArgumentDirection::Out)
                assignFlags = AssignFlags::OutputPort;

            if (!e->type->isEquivalent(*type)) {
                auto& comp = context.getCompilation();
                auto exprType = e->type;
                if (direction == ArgumentDirection::In) {
                    e = &Expression::convertAssignment(context, *type, *e, implicitNameRange);
                }
                else if (direction != ArgumentDirection::Ref) {
                    auto rhs = comp.emplace<EmptyArgumentExpression>(*type, implicitNameRange);
                    Expression::convertAssignment(context, *e->type, *rhs, implicitNameRange, &e,
                                                  &assignFlags);
                }

                // We should warn for this case unless convertAssignment already issued an error,
                // or if we're in an instance array unwrapping case.
                if ((parentInstance.arrayPath.empty() || direction == ArgumentDirection::Ref) &&
                    !e->bad() && !type->isError()) {
                    auto& diag = context.addDiag(diag::ImplicitNamedPortTypeMismatch,
                                                 implicitNameRange);
                    diag << port.name;
                    diag << *type;
                    diag << *exprType;

                    // There's no way to represent this expression for the ref case.
                    if (direction == ArgumentDirection::Ref)
                        e = comp.emplace<InvalidExpression>(e, comp.getErrorType());
                }
            }

            expr = e;
            if (!expr->bad()) {
                Expression::checkConnectionDirection(*expr, direction, context,
                                                     expr->sourceRange.start(), assignFlags);
            }
        }
        else {
            expr = &Expression::bindArgument(*type, direction, {}, *exprSyntax, context);
        }
    }
    else if (useDefault) {
        auto& ps = port.as<PortSymbol>();
        expr = ps.getInitializer();
    }

    return expr;
}